

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpikingPopulation.h
# Opt level: O0

void __thiscall
SpikingPopulation::SpikingPopulation
          (SpikingPopulation *this,int amount,string *type,Parameters *param)

{
  string *in_RDX;
  undefined8 *in_RDI;
  Parameters *in_stack_00000078;
  string *in_stack_00000080;
  int in_stack_0000008c;
  Population *in_stack_00000090;
  string local_40 [64];
  
  std::__cxx11::string::string(local_40,in_RDX);
  Population::Population(in_stack_00000090,in_stack_0000008c,in_stack_00000080,in_stack_00000078);
  std::__cxx11::string::~string(local_40);
  *in_RDI = &PTR_update_00127cb8;
  return;
}

Assistant:

SpikingPopulation(int amount, std::string type) : Population(amount, type) { }